

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psusan.c
# Opt level: O2

Plug * server_conn_plug(server_config *cfg,server_instance **inst_out)

{
  uint uVar1;
  server_instance *psVar2;
  Plug *pPVar3;
  
  psVar2 = (server_instance *)safemalloc(1,0x10,0);
  *(undefined8 *)psVar2 = 0;
  (psVar2->logpolicy).vt = (LogPolicyVtable *)0x0;
  uVar1 = cfg->next_id;
  cfg->next_id = uVar1 + 1;
  psVar2->id = uVar1;
  (psVar2->logpolicy).vt = &server_logpolicy_vt;
  if (inst_out != (server_instance **)0x0) {
    *inst_out = psVar2;
  }
  pPVar3 = ssh_server_plug(cfg->conf,cfg->ssc,(ssh_key **)0x0,0,(RSAKey *)0x0,(AuthPolicy *)0x0,
                           &psVar2->logpolicy,&unix_live_sftpserver_vt);
  return pPVar3;
}

Assistant:

static Plug *server_conn_plug(
    struct server_config *cfg, struct server_instance **inst_out)
{
    struct server_instance *inst = snew(struct server_instance);

    memset(inst, 0, sizeof(*inst));

    inst->id = cfg->next_id++;
    inst->logpolicy.vt = &server_logpolicy_vt;

    if (inst_out)
        *inst_out = inst;

    return ssh_server_plug(
        cfg->conf, cfg->ssc, NULL, 0, NULL, NULL,
        &inst->logpolicy, &unix_live_sftpserver_vt);
}